

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  BtShared *pBVar3;
  Pgno parent;
  Pgno PVar4;
  BtreePayload *pBVar5;
  int iVar6;
  void *__dest;
  size_t __n;
  MemPage *pMVar7;
  u64 v;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  KeyInfo *__src;
  u8 *__s;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  int loc;
  int rc;
  MemPage *pOvfl;
  int local_ac;
  uint *local_a8;
  uint local_a0;
  int local_9c;
  Pgno local_98;
  int local_94;
  KeyInfo *local_90;
  MemPage *local_88;
  int local_7c;
  BtCursor *local_78;
  ulong local_70;
  BtreePayload *local_68;
  uint *local_60;
  BtShared *local_58;
  UnpackedRecord local_50;
  BtShared *local_38;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  local_58 = pBtree->pBt;
  local_9c = seekResult;
  if (((pCur->curFlags & 0x20) != 0) &&
     (iVar6 = saveAllCursors(local_58,pCur->pgnoRoot,pCur), iVar6 != 0)) {
    return iVar6;
  }
  local_50.pKeyInfo = pCur->pKeyInfo;
  local_94 = flags;
  if (local_50.pKeyInfo == (KeyInfo *)0x0) {
    invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if (seekResult == 0) {
        iVar6 = sqlite3BtreeMovetoUnpacked
                          (pCur,(UnpackedRecord *)0x0,pX->nKey,(uint)(local_94 != 0),&local_9c);
        goto joined_r0x00212d26;
      }
    }
    else {
      local_9c = 0;
    }
  }
  else if ((flags & 2U) == 0 && seekResult == 0) {
    if (pX->nMem == 0) {
      iVar6 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)(flags != 0),&local_9c);
      local_ac = iVar6;
    }
    else {
      local_50.aMem = pX->aMem;
      local_50.default_rc = '\0';
      local_50.errCode = '\0';
      local_50.r1 = '\0';
      local_50.r2 = '\0';
      local_50._22_2_ = local_50._22_2_ & 0xff00;
      local_50.nField = pX->nMem;
      iVar6 = sqlite3BtreeMovetoUnpacked(pCur,&local_50,0,(uint)(flags != 0),&local_9c);
      local_ac = iVar6;
    }
joined_r0x00212d26:
    if (iVar6 != 0) {
      return iVar6;
    }
  }
  pMVar7 = pCur->apPage[pCur->iPage];
  puVar14 = (uint *)local_58->pTmpSpace;
  local_50.pKeyInfo = (KeyInfo *)0x0;
  pBVar3 = pMVar7->pBt;
  local_98 = 0;
  bVar1 = pMVar7->childPtrSize;
  uVar13 = (ulong)bVar1;
  local_a8 = puVar14;
  local_88 = pMVar7;
  local_68 = pX;
  if (pMVar7->intKey == '\0') {
    __src = (KeyInfo *)pX->pKey;
    uVar11 = pX->nKey;
    if ((uint)uVar11 < 0x80) {
      *(u8 *)((long)puVar14 + uVar13) = (u8)uVar11;
      uVar12 = 1;
    }
    else {
      uVar12 = sqlite3PutVarint((uchar *)((long)puVar14 + uVar13),(long)(int)(uint)uVar11);
      uVar12 = uVar12 & 0xff;
    }
    iVar6 = uVar12 + bVar1;
    v = uVar11 & 0xffffffff;
  }
  else {
    local_70 = (ulong)pX->nData;
    v = (long)pX->nZero + local_70;
    local_90 = (KeyInfo *)pX->pData;
    if ((uint)v < 0x80) {
      *(u8 *)((long)puVar14 + uVar13) = (u8)v;
      uVar12 = 1;
    }
    else {
      uVar12 = sqlite3PutVarint((uchar *)(uVar13 + (long)puVar14),v);
      uVar12 = uVar12 & 0xff;
    }
    uVar12 = uVar12 + bVar1;
    iVar6 = sqlite3PutVarint((uchar *)((ulong)uVar12 + (long)puVar14),local_68->nKey);
    iVar6 = iVar6 + uVar12;
    uVar11 = local_70;
    __src = local_90;
    pMVar7 = local_88;
  }
  iVar8 = (int)v;
  if ((int)(uint)pMVar7->maxLocal < iVar8) {
    uVar2 = pMVar7->minLocal;
    uVar12 = (iVar8 - (uint)uVar2) % (pMVar7->pBt->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)pMVar7->maxLocal < (int)uVar12) {
      uVar12 = (uint)uVar2;
    }
    uVar13 = (ulong)uVar12;
    local_a0 = uVar12 + 4 + iVar6;
    local_60 = (uint *)((long)(int)(uVar12 + iVar6) + (long)local_a8);
LAB_00212ee7:
    __s = (u8 *)((long)iVar6 + (long)local_a8);
    local_90 = (KeyInfo *)0x0;
    local_78 = pCur;
    local_38 = pBVar3;
    do {
      pBVar3 = local_38;
      parent = local_98;
      iVar6 = (int)uVar13;
      local_70 = v;
      if (iVar6 == 0) {
        if (local_38->autoVacuum != '\0') {
          do {
            uVar9 = local_98;
            local_98 = uVar9 + 1;
            uVar12 = 0;
            if (1 < local_98) {
              iVar6 = (uVar9 - 1) - (uVar9 - 1) % (local_38->usableSize / 5 + 1);
              uVar12 = iVar6 + (uint)(iVar6 + 1U == (uint)sqlite3PendingByte / local_38->pageSize) +
                       2;
            }
          } while ((local_98 == uVar12) || (uVar9 == (uint)sqlite3PendingByte / local_38->pageSize))
          ;
          local_98 = uVar9 + 1;
        }
        iVar6 = allocateBtreePage(local_38,(MemPage **)&local_50,&local_98,local_98,'\0');
        PVar4 = local_98;
        local_7c = iVar6;
        if ((pBVar3->autoVacuum == '\0') || (iVar6 != 0)) {
          if (iVar6 == 0) goto LAB_00213000;
        }
        else {
          ptrmapPut(pBVar3,local_98,'\x04' - (parent == 0),parent,&local_7c);
          iVar6 = local_7c;
          if (local_7c == 0) {
LAB_00213000:
            *local_60 = PVar4 >> 0x18 | (PVar4 & 0xff0000) >> 8 | (PVar4 & 0xff00) << 8 |
                        PVar4 << 0x18;
            if (local_90 != (KeyInfo *)0x0) {
              sqlite3PagerUnrefNotNull((DbPage *)local_90[2].aColl[0]);
            }
            local_60 = *(uint **)(local_50.pKeyInfo + 2);
            *local_60 = 0;
            local_90 = local_50.pKeyInfo;
            __s = (u8 *)(*(long *)(local_50.pKeyInfo + 2) + 4);
            iVar6 = pBVar3->usableSize - 4;
            goto LAB_0021304b;
          }
          if (local_50.pKeyInfo != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_50.pKeyInfo[2].aColl[0]);
          }
        }
        if (local_90 == (KeyInfo *)0x0) {
          return iVar6;
        }
        goto LAB_0021310b;
      }
LAB_0021304b:
      iVar8 = iVar6;
      if ((int)local_70 < iVar6) {
        iVar8 = (int)local_70;
      }
      iVar10 = (int)uVar11;
      if (iVar10 < 1) {
        __n = (size_t)iVar8;
        memset(__s,0,__n);
      }
      else {
        if (iVar10 <= iVar8) {
          iVar8 = iVar10;
        }
        __n = (size_t)iVar8;
        memcpy(__s,__src,__n);
      }
      __s = __s + __n;
      __src = (KeyInfo *)((long)__src->aColl + (__n - 0x20));
      uVar11 = (ulong)(uint)(iVar10 - iVar8);
      uVar13 = (ulong)(uint)(iVar6 - iVar8);
      uVar12 = (int)local_70 - iVar8;
      v = (u64)uVar12;
    } while (uVar12 != 0 && iVar8 <= (int)local_70);
    iVar6 = 0;
    pCur = local_78;
    if (local_90 != (KeyInfo *)0x0) {
LAB_0021310b:
      pCur = local_78;
      sqlite3PagerUnrefNotNull((DbPage *)local_90[2].aColl[0]);
      local_ac = iVar6;
      if (iVar6 != 0) {
        return iVar6;
      }
      goto LAB_00213127;
    }
  }
  else {
    local_a0 = 4;
    if (4 < iVar8 + iVar6) {
      local_a0 = iVar8 + iVar6;
    }
    local_60 = local_a8;
    uVar13 = v & 0xffffffff;
    if (0 < iVar8) goto LAB_00212ee7;
  }
  local_ac = 0;
LAB_00213127:
  pBVar5 = local_68;
  pMVar7 = local_88;
  uVar2 = pCur->ix;
  uVar12 = (uint)uVar2;
  if (local_9c == 0) {
    iVar6 = sqlite3PagerWrite(local_88->pDbPage);
    if (iVar6 != 0) {
      return iVar6;
    }
    puVar14 = (uint *)(pMVar7->aData +
                      (CONCAT11(pMVar7->aCellIdx[(ulong)uVar2 * 2],
                                pMVar7->aCellIdx[(ulong)uVar2 * 2 + 1]) & pMVar7->maskPage));
    if (pMVar7->leaf == '\0') {
      *local_a8 = *puVar14;
    }
    local_ac = clearCell(pMVar7,(uchar *)puVar14,(CellInfo *)&local_50);
    pMVar7 = local_88;
    if (((local_a0 == (ushort)local_50._22_2_) &&
        (CONCAT22(local_50._18_2_,local_50.nField) == (uint)(ushort)local_50._20_2_)) &&
       ((local_58->autoVacuum == '\0' || (local_a0 < local_88->minLocal)))) {
      if (local_88->aDataEnd < (u8 *)((long)puVar14 + (ulong)local_a0)) {
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x108ba,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        return 0xb;
      }
      memcpy(puVar14,local_a8,(ulong)local_a0);
      return 0;
    }
    dropCell(local_88,(uint)uVar2,(uint)(ushort)local_50._22_2_,&local_ac);
    if (local_ac != 0) {
      return local_ac;
    }
  }
  else if ((local_9c < 0) && (local_88->nCell != 0)) {
    pCur->ix = uVar2 + 1;
    uVar12 = (uint)(ushort)(uVar2 + 1);
    pCur->curFlags = pCur->curFlags & 0xfd;
  }
  insertCell(pMVar7,uVar12,(u8 *)local_a8,local_a0,(u8 *)0x0,0,&local_ac);
  (pCur->info).nSize = 0;
  iVar6 = local_ac;
  if (pMVar7->nOverflow != '\0') {
    pCur->curFlags = pCur->curFlags & 0xfd;
    iVar6 = balance(pCur);
    pCur->apPage[pCur->iPage]->nOverflow = '\0';
    pCur->eState = '\0';
    if ((iVar6 == 0 & (byte)local_94 >> 1) == 1) {
      iVar6 = moveToRoot(pCur);
      if (pCur->pKeyInfo != (KeyInfo *)0x0) {
        __dest = sqlite3Malloc(pBVar5->nKey);
        pCur->pKey = __dest;
        if (__dest == (void *)0x0) {
          iVar6 = 7;
        }
        else {
          memcpy(__dest,pBVar5->pKey,pBVar5->nKey);
        }
      }
      pCur->eState = '\x03';
      pCur->nKey = pBVar5->nKey;
    }
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.  */
    assert( (flags & BTREE_SAVEPOSITION)==0 || 
            ((pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey) );

    /* If the cursor is currently on the last row and we are appending a
    ** new row onto the end, set the "loc" to avoid an unnecessary
    ** btreeMoveto() call */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      loc = 0;
    }else if( loc==0 ){
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
    if( pX->nMem ){
      UnpackedRecord r;
      r.pKeyInfo = pCur->pKeyInfo;
      r.aMem = pX->aMem;
      r.nField = pX->nMem;
      r.default_rc = 0;
      r.errCode = 0;
      r.r1 = 0;
      r.r2 = 0;
      r.eqSeen = 0;
      rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
    }else{
      rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
    }
    if( rc ) return rc;
  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload 
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). 
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->apPage[pCur->iPage]->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      rc = moveToRoot(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->apPage[pCur->iPage]->nOverflow==0 );

end_insert:
  return rc;
}